

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O3

void __thiscall
vkt::sr::anon_unknown_0::TriangleDerivateCaseInstance::TriangleDerivateCaseInstance
          (TriangleDerivateCaseInstance *this,Context *context,UniformSetup *uniformSetup,
          DerivateCaseDefinition *definitions,DerivateCaseValues *values)

{
  VkFormat VVar1;
  VkSampleCountFlagBits sampleCount;
  deUint32 internalFormat;
  ShaderEvaluator local_40;
  
  ShaderEvaluator::ShaderEvaluator(&local_40,(ShaderEvalFunc)0x0);
  ShaderRenderCaseInstance::ShaderRenderCaseInstance
            (&this->super_ShaderRenderCaseInstance,context,true,&local_40,uniformSetup,
             (AttributeSetupFunc)0x0,IMAGE_BACKING_MODE_REGULAR,0);
  ShaderEvaluator::~ShaderEvaluator(&local_40);
  (this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__ShaderRenderCaseInstance_00d2bd58;
  this->m_definitions = definitions;
  this->m_values = values;
  *(undefined8 *)(this->super_ShaderRenderCaseInstance).m_renderSize.m_data = 0x8500000063;
  internalFormat = 0x8058;
  if (definitions->surfaceType == SURFACETYPE_FLOAT_FBO) {
    internalFormat = 0x8d70;
  }
  local_40._vptr_ShaderEvaluator = (_func_int **)glu::mapGLInternalFormat(internalFormat);
  VVar1 = ::vk::mapTextureFormat((TextureFormat *)&local_40);
  (this->super_ShaderRenderCaseInstance).m_colorFormat = VVar1;
  sampleCount = 0;
  if ((ulong)(uint)definitions->numSamples < 5) {
    sampleCount = *(VkSampleCountFlagBits *)
                   (&DAT_00b19e2c + (ulong)(uint)definitions->numSamples * 4);
  }
  ShaderRenderCaseInstance::setSampleCount(&this->super_ShaderRenderCaseInstance,sampleCount);
  return;
}

Assistant:

TriangleDerivateCaseInstance::TriangleDerivateCaseInstance (Context&						context,
															const UniformSetup&				uniformSetup,
															const DerivateCaseDefinition&	definitions,
															const DerivateCaseValues&		values)
	: ShaderRenderCaseInstance	(context, true, DE_NULL, uniformSetup, DE_NULL)
	, m_definitions				(definitions)
	, m_values					(values)
{
	m_renderSize	= tcu::UVec2(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	m_colorFormat	= vk::mapTextureFormat(glu::mapGLInternalFormat(m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO ? GL_RGBA32UI : GL_RGBA8));

	setSampleCount(getVkSampleCount(definitions.numSamples));
}